

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  byte bVar1;
  char *pcVar2;
  Table *pTVar3;
  Index *aLog;
  long lVar4;
  Index *in_R8;
  Index fakeIdx;
  LogEst aLStack_88 [46];
  LogEst local_2c;
  
  if (argv == (char **)0x0) {
    return 0;
  }
  if (*argv == (char *)0x0) {
    return 0;
  }
  if (argv[2] == (char *)0x0) {
    return 0;
  }
  pTVar3 = sqlite3FindTable(*pData,*argv,*(char **)((long)pData + 8));
  if (pTVar3 == (Table *)0x0) {
    return 0;
  }
  pcVar2 = argv[1];
  if (pcVar2 == (char *)0x0) {
    aLog = (Index *)0x0;
  }
  else {
    if (*argv != (char *)0x0) {
      lVar4 = 0;
      do {
        bVar1 = (*argv)[lVar4];
        in_R8 = (Index *)(ulong)(byte)pcVar2[lVar4];
        if (bVar1 == pcVar2[lVar4]) {
          if ((ulong)bVar1 == 0) goto LAB_0016b696;
        }
        else if (""[bVar1] != *(uchar *)&in_R8[0x449c].aColExpr) break;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    aLog = sqlite3FindIndex(*pData,pcVar2,*(char **)((long)pData + 8));
  }
LAB_0016b623:
  pcVar2 = argv[2];
  if (aLog == (Index *)0x0) {
    local_2c = pTVar3->szTabRow;
    decodeIntArray(pcVar2,1,(tRowcnt *)&pTVar3->nRowLogEst,aLStack_88,in_R8);
    pTVar3->szTabRow = local_2c;
  }
  else {
    aLog->field_0x63 = aLog->field_0x63 & 0xfb;
    decodeIntArray(pcVar2,aLog->nKeyCol + 1,(tRowcnt *)aLog->aiRowLogEst,(LogEst *)aLog,in_R8);
    aLog->field_0x63 = aLog->field_0x63 | 0x80;
    if (aLog->pPartIdxWhere != (Expr *)0x0) {
      return 0;
    }
    pTVar3->nRowLogEst = *aLog->aiRowLogEst;
  }
  *(byte *)&pTVar3->tabFlags = (byte)pTVar3->tabFlags | 0x10;
  return 0;
LAB_0016b696:
  for (aLog = pTVar3->pIndex; (aLog != (Index *)0x0 && ((*(ushort *)&aLog->field_0x63 & 3) != 2));
      aLog = aLog->pNext) {
  }
  goto LAB_0016b623;
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1]==0 ){
    pIndex = 0;
  }else if( sqlite3_stricmp(argv[0],argv[1])==0 ){
    pIndex = sqlite3PrimaryKeyIndex(pTable);
  }else{
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }
  z = argv[2];

  if( pIndex ){
    tRowcnt *aiRowEst = 0;
    int nCol = pIndex->nKeyCol+1;
#ifdef SQLITE_ENABLE_STAT4
    /* Index.aiRowEst may already be set here if there are duplicate
    ** sqlite_stat1 entries for this index. In that case just clobber
    ** the old data with the new instead of allocating a new array.  */
    if( pIndex->aiRowEst==0 ){
      pIndex->aiRowEst = (tRowcnt*)sqlite3MallocZero(sizeof(tRowcnt) * nCol);
      if( pIndex->aiRowEst==0 ) sqlite3OomFault(pInfo->db);
    }
    aiRowEst = pIndex->aiRowEst;
#endif
    pIndex->bUnordered = 0;
    decodeIntArray((char*)z, nCol, aiRowEst, pIndex->aiRowLogEst, pIndex);
    pIndex->hasStat1 = 1;
    if( pIndex->pPartIdxWhere==0 ){
      pTable->nRowLogEst = pIndex->aiRowLogEst[0];
      pTable->tabFlags |= TF_HasStat1;
    }
  }else{
    Index fakeIdx;
    fakeIdx.szIdxRow = pTable->szTabRow;
#ifdef SQLITE_ENABLE_COSTMULT
    fakeIdx.pTable = pTable;
#endif
    decodeIntArray((char*)z, 1, 0, &pTable->nRowLogEst, &fakeIdx);
    pTable->szTabRow = fakeIdx.szIdxRow;
    pTable->tabFlags |= TF_HasStat1;
  }

  return 0;
}